

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O0

void __thiscall PerseusStationary::SetBeliefSet(PerseusStationary *this,BeliefSet *S)

{
  void *pvVar1;
  long in_RDI;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_00000018;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_00000020;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_ffffffffffffffe0
  ;
  
  if (((*(byte *)(in_RDI + 0x20) & 1) != 0) &&
     (pvVar1 = *(void **)(in_RDI + 0xc0), pvVar1 != (void *)0x0)) {
    std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~vector
              (in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = operator_new(0x18);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (in_stack_00000020,in_stack_00000018);
  *(void **)(in_RDI + 0xc0) = pvVar1;
  *(undefined1 *)(in_RDI + 0x20) = 1;
  return;
}

Assistant:

void PerseusStationary::SetBeliefSet(const BeliefSet &S)
{
    if(_m_beliefsInitialized)
        delete(_m_beliefs);
    _m_beliefs=new BeliefSet(S);
    _m_beliefsInitialized=true;
}